

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<double> *in)

{
  long lVar1;
  ulong uVar2;
  
  if (0 < num && transid != 0) {
    uVar2 = 0;
    do {
      if (((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 < 1) || ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      in->fElem[(in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar2] =
           -in->fElem[lVar1 * uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)num != uVar2);
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<REAL> &in) {
		
		if(transid == 0) return;
		int i;
		for(i=0;i<num;i++) in(0,i) = -in(0,i);
	}